

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thrdd.c
# Opt level: O0

void Curl_async_thrdd_shutdown(Curl_easy *data)

{
  Curl_async *pCVar1;
  async_thrdd_ctx *thrdd;
  Curl_easy *data_local;
  
  pCVar1 = &(data->state).async;
  if ((((pCVar1->thrdd).addr == (async_thrdd_addr_ctx *)0x0) ||
      (((pCVar1->thrdd).addr)->thread_hnd == (pthread_t *)0x0)) ||
     ((*(ulong *)&(data->set).field_0x89c >> 9 & 1) != 0)) {
    async_thrdd_destroy(data);
  }
  else {
    asyn_thrdd_await(data,(pCVar1->thrdd).addr,(Curl_dns_entry **)0x0);
  }
  return;
}

Assistant:

void Curl_async_thrdd_shutdown(struct Curl_easy *data)
{
  struct async_thrdd_ctx *thrdd = &data->state.async.thrdd;

  /* If we are still resolving, we must wait for the threads to fully clean up,
     unfortunately. Otherwise, we can simply cancel to clean up any resolver
     data. */
  if(thrdd->addr && (thrdd->addr->thread_hnd != curl_thread_t_null) &&
     !data->set.quick_exit)
    (void)asyn_thrdd_await(data, thrdd->addr, NULL);
  else
    async_thrdd_destroy(data);
}